

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

void __thiscall
duckdb::PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>::
Insert(PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator> *this,
      string_t value)

{
  long lVar1;
  bool bVar2;
  primitive_dictionary_entry_t *this_00;
  string_t *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
  *unaff_retaddr;
  primitive_dictionary_entry_t *entry;
  string_t *in_stack_000000e0;
  PrimitiveDictionary<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetStringOperator>
  *in_stack_000000e8;
  
  if ((*(byte *)(in_RDI + 0x98) & 1) == 0) {
    this_00 = Lookup(unaff_retaddr,in_RDX);
    bVar2 = primitive_dictionary_entry_t::IsEmpty(this_00);
    if (bVar2) {
      if ((*(ulong *)(in_RDI + 8) < *(long *)(in_RDI + 0x10) + 1U) ||
         (bVar2 = AddToTarget<duckdb::string_t,_0>(in_stack_000000e8,in_stack_000000e0), !bVar2)) {
        *(undefined1 *)(in_RDI + 0x98) = 1;
      }
      else {
        *(undefined8 *)&(this_00->value).value = in_RSI;
        (this_00->value).value.pointer.ptr = (char *)in_RDX;
        lVar1 = *(long *)(in_RDI + 0x10);
        *(long *)(in_RDI + 0x10) = lVar1 + 1;
        this_00->index = (uint32_t)lVar1;
      }
    }
  }
  return;
}

Assistant:

void Insert(SRC value) {
		if (full) {
			return;
		}
		auto &entry = Lookup(value);
		if (entry.IsEmpty()) {
			if (size + 1 > maximum_size || !AddToTarget(value)) {
				full = true;
				return;
			}
			entry.value = value;
			entry.index = size++;
		}
	}